

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void generateData(char *dataDir,char *bundleName)

{
  uint16_t *puVar1;
  UBool UVar2;
  int16_t iVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  uint extraout_EAX;
  size_t sVar7;
  int32_t *piVar8;
  UHashElement *pUVar9;
  int32_t *piVar10;
  UNewDataMemory *pData;
  int iVar11;
  int32_t count;
  int32_t *unaff_RBX;
  int32_t *unaff_RBP;
  UNewTrie *trie;
  char *comment;
  uint uVar12;
  int32_t *unaff_R12;
  UChar32 UVar13;
  UErrorCode *unaff_R15;
  int32_t *piVar14;
  UErrorCode *pUVar15;
  UErrorCode *pUVar16;
  UErrorCode errorCode;
  char cStack_91;
  int32_t *piStack_90;
  int32_t *piStack_88;
  UNewDataMemory *pUStack_80;
  int32_t *piStack_78;
  code *pcStack_70;
  UErrorCode local_68;
  uint local_64;
  UChar32 local_60;
  int32_t local_5c;
  ulong local_58;
  uint local_4c;
  int32_t *local_48;
  UNewDataMemory *local_40;
  char *local_38;
  
  pUVar15 = &local_68;
  pUVar16 = &local_68;
  local_68 = U_ZERO_ERROR;
  pcStack_70 = (code *)0x10a429;
  local_38 = dataDir;
  sVar7 = strlen(bundleName);
  pcStack_70 = (code *)0x10a432;
  local_48 = (int32_t *)uprv_malloc_63(sVar7 + 100);
  local_5c = -1;
  if (hashTable != (UHashtable *)0x0) {
    pcStack_70 = (code *)0x10a454;
    uVar4 = uhash_count_63(hashTable);
    unaff_RBX = (int32_t *)(ulong)uVar4;
    pcStack_70 = (code *)0x10a467;
    mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
    local_4c = uVar4;
    if ((int)uVar4 < 1) {
      piVar10 = (int32_t *)0x1;
    }
    else {
      local_58 = 0;
      unaff_RBP = (int32_t *)0x0;
      piVar14 = (int32_t *)0x0;
      local_40 = (UNewDataMemory *)bundleName;
      piVar10 = (int32_t *)0x1;
LAB_0010a49a:
      do {
        piVar8 = piVar10;
        pcStack_70 = (code *)0x10a4a9;
        pUVar9 = uhash_nextElement_63(hashTable,&local_5c);
        unaff_RBX = &local_5c;
        unaff_R15 = piVar14;
        if (pUVar9 != (UHashElement *)0x0) {
          UVar13 = (pUVar9->key).integer;
          bundleName = (char *)(pUVar9->value).pointer;
          if (piVar8 != unaff_RBP) {
            if ((int)unaff_RBP < 4) {
              uVar4 = (uint)currentIndex;
              indexes[(long)piVar8 + 2] = uVar4;
              local_58 = local_58 & 0xffffffff;
              if (piVar8 == (int32_t *)0x4) {
                local_58 = (ulong)uVar4;
              }
            }
            unaff_RBP = (int32_t *)((ulong)piVar8 & 0xffffffff);
          }
          piVar10 = piVar8;
          if (piVar8 != (int32_t *)
                        (ulong)(uint)(int)(short)((UNewDataMemory *)bundleName)->headerSize)
          goto LAB_0010a49a;
          local_64 = (uint)unaff_RBP;
          uVar12 = (uint)(ushort)currentIndex;
          unaff_R12 = (int32_t *)(ulong)uVar12;
          uVar4 = uVar12 * 4 + 2;
          unaff_RBX = (int32_t *)(ulong)uVar4;
          unaff_RBP = piVar14;
          unaff_R15 = &local_5c;
          if ((ushort)uVar4 < 0xfff1) {
            pcStack_70 = (code *)0x10a52e;
            local_60 = UVar13;
            uVar5 = utrie_get32_63(sprepTrie,UVar13,(UBool *)0x0);
            if (uVar5 == 0) {
LAB_0010a548:
              pcStack_70 = (code *)0x10a55b;
              UVar2 = utrie_set32_63(sprepTrie,local_60,(uint)unaff_RBX & 0xffff);
              puVar1 = mappingData;
              if (UVar2 == '\0') goto LAB_0010a7de;
              iVar6 = (int)currentIndex;
              count = (int32_t)(short)((UNewDataMemory *)bundleName)->headerSize;
              if (0x3fbe < count + iVar6) goto LAB_0010a7d9;
              iVar3 = currentIndex;
              if ((int32_t *)0x3 < piVar8) {
                iVar3 = currentIndex + 1;
                currentIndex = iVar3;
                mappingData[iVar6] = (uint16_t)piVar8;
                count = (int32_t)(short)((UNewDataMemory *)bundleName)->headerSize;
              }
              unaff_RBP = (int32_t *)(ulong)local_64;
              pcStack_70 = (code *)0x10a5bb;
              u_memmove_63((UChar *)(puVar1 + iVar3),(UChar *)((UNewDataMemory *)bundleName)->file,
                           count);
              currentIndex = currentIndex + ((UNewDataMemory *)bundleName)->headerSize;
              unaff_RBX = &local_5c;
              unaff_R15 = piVar14;
              if (mappingDataCapacity < currentIndex) goto LAB_0010a7d4;
              piVar14 = (int32_t *)(ulong)((int)piVar14 + 1);
              goto LAB_0010a49a;
            }
            if (uVar5 == 0xfff2) {
              unaff_RBX = (int32_t *)(ulong)(uVar12 << 2 | 3);
              unaff_R12 = unaff_RBX;
              goto LAB_0010a548;
            }
          }
          else {
            pcStack_70 = (code *)0x10a7d4;
            generateData_cold_5();
LAB_0010a7d4:
            pcStack_70 = (code *)0x10a7d9;
            generateData_cold_1();
LAB_0010a7d9:
            pcStack_70 = (code *)0x10a7de;
            generateData_cold_2();
LAB_0010a7de:
            pcStack_70 = (code *)0x10a7e3;
            generateData_cold_3();
          }
          pcStack_70 = (code *)0x10a7ec;
          generateData_cold_4();
          goto LAB_0010a7ec;
        }
        piVar10 = (int32_t *)((long)piVar8 + 1);
        local_5c = -1;
      } while ((int)piVar14 < (int)local_4c);
      bundleName = (char *)local_40;
      if ((int32_t *)0x2 < piVar8) {
        indexes[6] = (int32_t)local_58;
        goto LAB_0010a62b;
      }
    }
    indexes[(long)piVar10 + 2] = currentIndex + 1;
  }
LAB_0010a62b:
  pcStack_70 = (code *)0x10a656;
  uVar4 = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                             &local_68);
  if (local_68 < U_ILLEGAL_ARGUMENT_ERROR) {
    unaff_R12 = (int32_t *)(ulong)uVar4;
    uVar12 = uVar4 + mappingDataCapacity * 2 + 0x40;
    unaff_RBP = (int32_t *)(ulong)uVar12;
    if (beVerbose != '\0') {
      pcStack_70 = (code *)0x10a68f;
      printf("size of sprep trie              %5u bytes\n",unaff_R12);
      pcStack_70 = (code *)0x10a6a3;
      printf("size of icudt63l_%s.spp contents: %ld bytes\n",bundleName,(long)(int)uVar12);
      pcStack_70 = (code *)0x10a6b9;
      printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity * 2));
      pcStack_70 = (code *)0x10a6ce;
      printf("Number of code units in mappingData (currentIndex) are: %i \n",
             (ulong)(uint)(int)currentIndex);
      pcStack_70 = (code *)0x10a6e2;
      printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
    }
    unaff_RBX = local_48;
    *(undefined1 *)local_48 = 0;
    pcStack_70 = (code *)0x10a6f5;
    strcat((char *)local_48,bundleName);
    comment = (char *)0x0;
    if (haveCopyright != '\0') {
      comment = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
    }
    pcStack_70 = (code *)0x10a72e;
    pData = udata_create(local_38,"spp",(char *)unaff_RBX,&dataInfo,comment,&local_68);
    unaff_R15 = &local_68;
    if (U_ZERO_ERROR < local_68) goto LAB_0010a7f4;
    indexes[1] = mappingDataCapacity * 2;
    pcStack_70 = (code *)0x10a765;
    indexes[0] = uVar4;
    udata_writeBlock(pData,indexes,0x40);
    pcStack_70 = (code *)0x10a777;
    udata_writeBlock(pData,generateData::sprepTrieBlock,uVar4);
    pcStack_70 = (code *)0x10a78c;
    udata_writeBlock(pData,mappingData,indexes[1]);
    pcStack_70 = (code *)0x10a79a;
    uVar4 = udata_finish(pData,&local_68);
    if (local_68 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (uVar4 == uVar12) {
        if (hashTable != (UHashtable *)0x0) {
          pcStack_70 = (code *)0x10a7b6;
          uhash_close_63(hashTable);
        }
        pcStack_70 = (code *)0x10a7c0;
        uprv_free_63(local_48);
        return;
      }
      goto LAB_0010a804;
    }
  }
  else {
LAB_0010a7ec:
    pcStack_70 = (code *)0x10a7f4;
    generateData_cold_9();
LAB_0010a7f4:
    pUVar15 = unaff_R15;
    pData = (UNewDataMemory *)bundleName;
    pcStack_70 = (code *)0x10a7fc;
    generateData_cold_8();
  }
  pcStack_70 = (code *)0x10a804;
  generateData_cold_7();
  pUVar16 = pUVar15;
  uVar4 = extraout_EAX;
LAB_0010a804:
  trie = (UNewTrie *)(ulong)uVar4;
  UVar13 = (UChar32)unaff_RBP;
  pcStack_70 = getFoldedValue;
  generateData_cold_6();
  iVar6 = UVar13 + 0x400;
  piStack_90 = unaff_RBX;
  piStack_88 = unaff_R12;
  pUStack_80 = pData;
  piStack_78 = pUVar16;
  pcStack_70 = (code *)unaff_RBP;
  while( true ) {
    uVar5 = utrie_get32_63(trie,UVar13,&cStack_91);
    iVar11 = 0x20;
    if ((cStack_91 == '\0') && (iVar11 = 1, uVar5 != 0)) break;
    UVar13 = UVar13 + iVar11;
    if (iVar6 <= UVar13) {
      return;
    }
  }
  return;
}

Assistant:

extern void
generateData(const char *dataDir, const char* bundleName) {
    static uint8_t sprepTrieBlock[100000];

    UNewDataMemory *pData;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t size, dataLength;
    char* fileName = (char*) uprv_malloc(uprv_strlen(bundleName) +100);

#if UCONFIG_NO_IDNA

    size=0;

#else

    int32_t sprepTrieSize;

    /* sort and add mapping data */
    storeMappingData();
    
    sprepTrieSize=utrie_serialize(sprepTrie, sprepTrieBlock, sizeof(sprepTrieBlock), getFoldedValue, TRUE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "error: utrie_serialize(sprep trie) failed, %s\n", u_errorName(errorCode));
        exit(errorCode);
    }
    
    size = sprepTrieSize + mappingDataCapacity*U_SIZEOF_UCHAR + sizeof(indexes);
    if(beVerbose) {
        printf("size of sprep trie              %5u bytes\n", (int)sprepTrieSize);
        printf("size of " U_ICUDATA_NAME "_%s." DATA_TYPE " contents: %ld bytes\n", bundleName,(long)size);
        printf("size of mapping data array %5u bytes\n",(int)mappingDataCapacity * U_SIZEOF_UCHAR);
        printf("Number of code units in mappingData (currentIndex) are: %i \n", currentIndex);
        printf("Maximum length of the mapping string is : %i \n", (int)maxLength);
    }

#endif

    fileName[0]=0;
    uprv_strcat(fileName,bundleName);
    /* write the data */
    pData=udata_create(dataDir, DATA_TYPE, fileName, &dataInfo,
                       haveCopyright ? U_COPYRIGHT_STRING : NULL, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: unable to create the output file, error %d\n", errorCode);
        exit(errorCode);
    }

#if !UCONFIG_NO_IDNA

    indexes[_SPREP_INDEX_TRIE_SIZE]=sprepTrieSize;
    indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]=mappingDataCapacity*U_SIZEOF_UCHAR;
    
    udata_writeBlock(pData, indexes, sizeof(indexes));
    udata_writeBlock(pData, sprepTrieBlock, sprepTrieSize);
    udata_writeBlock(pData, mappingData, indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]);
    

#endif

    /* finish up */
    dataLength=udata_finish(pData, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: error %d writing the output file\n", errorCode);
        exit(errorCode);
    }

    if(dataLength!=size) {
        fprintf(stderr, "gensprep error: data length %ld != calculated size %ld\n",
            (long)dataLength, (long)size);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }

#if !UCONFIG_NO_IDNA
    /* done with writing the data .. close the hashtable */
    if (hashTable != NULL) {
        uhash_close(hashTable);
    }
#endif

    uprv_free(fileName);
}